

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uts.c
# Opt level: O3

void uts_helpMessage(void)

{
  char *pcVar1;
  
  pcVar1 = impl_getName();
  printf("  UTS - Unbalanced Tree Search %s (%s)\n\n","2.1",pcVar1);
  puts("    usage:  uts-bin [parameter value] ...\n");
  puts("  parm type  description");
  puts("  ==== ====  =========================================");
  puts("\n  Benchmark Parameters:");
  puts("   -t  int   tree type (0: BIN, 1: GEO, 2: HYBRID, 3: BALANCED)");
  puts("   -b  dble  root branching factor");
  puts("   -r  int   root seed 0 <= r < 2^31 ");
  puts("   -a  int   GEO: tree shape function ");
  puts("   -d  int   GEO, BALANCED: tree depth");
  puts("   -q  dble  BIN: probability of non-leaf node");
  puts("   -m  int   BIN: number of children for non-leaf node");
  puts("   -f  dble  HYBRID: fraction of depth for GEO -> BIN transition");
  puts("   -g  int   compute granularity: number of rng_spawns per node");
  puts("   -v  int   nonzero to set verbose output");
  puts("   -x  int   debug level");
  puts("\n  Additional Implementation Parameters:");
  impl_helpMessage();
  putchar(10);
  return;
}

Assistant:

void uts_helpMessage() {
  printf("  UTS - Unbalanced Tree Search %s (%s)\n\n", UTS_VERSION, impl_getName());
  printf("    usage:  uts-bin [parameter value] ...\n\n");
  printf("  parm type  description\n");    
  printf("  ==== ====  =========================================\n");
  printf("\n  Benchmark Parameters:\n");
  printf("   -t  int   tree type (0: BIN, 1: GEO, 2: HYBRID, 3: BALANCED)\n");
  printf("   -b  dble  root branching factor\n");
  printf("   -r  int   root seed 0 <= r < 2^31 \n");
  printf("   -a  int   GEO: tree shape function \n");
  printf("   -d  int   GEO, BALANCED: tree depth\n");
  printf("   -q  dble  BIN: probability of non-leaf node\n");
  printf("   -m  int   BIN: number of children for non-leaf node\n");
  printf("   -f  dble  HYBRID: fraction of depth for GEO -> BIN transition\n");
  printf("   -g  int   compute granularity: number of rng_spawns per node\n");
  printf("   -v  int   nonzero to set verbose output\n");
  printf("   -x  int   debug level\n");

  // Get help message from the implementation
  printf("\n  Additional Implementation Parameters:\n");
  impl_helpMessage();
  printf("\n");
}